

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

set_icase *
get_script_dependencies
          (set_icase *__return_storage_ptr__,string *fname,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *searchedScripts,set_icase *hud_files)

{
  _Rb_tree_header *p_Var1;
  pointer *s;
  double dVar2;
  undefined4 __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  long *plVar7;
  istream *piVar8;
  long lVar9;
  undefined8 *puVar10;
  undefined8 uVar11;
  undefined8 extraout_RAX;
  iterator iVar12;
  ulong uVar13;
  iterator iVar14;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  string *psVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  long *plVar17;
  undefined8 *puVar18;
  size_type *psVar19;
  pointer pcVar20;
  _Alloc_hider _Var21;
  uint __len;
  long lVar22;
  ulong uVar23;
  uint uVar24;
  bool bVar25;
  bool bVar26;
  long *local_bf8;
  ifstream myfile;
  long local_be8;
  long lStack_be0;
  undefined1 local_9f0 [8];
  set_icase includeRes;
  string local_7e8;
  string local_7c8;
  string local_7a8;
  undefined1 local_788 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ret1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  undefined1 local_748 [32];
  undefined1 local_728 [16];
  string local_718;
  string local_6f8;
  string local_6d8;
  key_type local_6b8;
  key_type local_698;
  key_type local_678;
  string local_658;
  string local_638;
  string local_618;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  key_type local_4f8;
  key_type local_4d8;
  key_type local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  undefined1 local_3b8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ret2;
  undefined1 local_390 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380;
  undefined1 local_370 [16];
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  long local_2e0;
  _Base_ptr local_2d8;
  size_type *local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  size_type *local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  long *local_230;
  long local_228;
  undefined1 local_220;
  undefined7 uStack_21f;
  long lStack_218;
  set_icase *local_210;
  undefined1 local_208 [8];
  string line;
  long local_1e0;
  undefined1 local_1d8;
  undefined7 uStack_1d7;
  _Base_ptr p_Stack_1d0;
  size_type *local_1c8;
  pointer local_1c0;
  size_type local_1b8;
  size_type sStack_1b0;
  size_type *local_1a8;
  string folder;
  string trace;
  undefined1 auStack_148 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  undefined1 local_128 [8];
  string tmpVal;
  string sprite_val;
  undefined1 local_d8 [8];
  string spr;
  string sound_val;
  string ext;
  string concatVal;
  undefined1 local_50 [8];
  string include;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1a8 = &folder._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"scripts/maps/","");
  pcVar20 = (fname->_M_dataplus)._M_p;
  local_230 = (long *)&local_220;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_230,pcVar20,pcVar20 + fname->_M_string_length);
  lVar9 = local_228;
  plVar7 = local_230;
  if (local_228 != 0) {
    lVar22 = 0;
    do {
      iVar5 = tolower((int)*(char *)((long)plVar7 + lVar22));
      *(char *)((long)plVar7 + lVar22) = (char)iVar5;
      lVar22 = lVar22 + 1;
    } while (lVar9 != lVar22);
  }
  local_bf8 = local_230;
  if (local_230 == (long *)&local_220) {
    lStack_be0 = lStack_218;
    local_bf8 = &local_be8;
  }
  local_be8 = CONCAT71(uStack_21f,local_220);
  _myfile = local_228;
  local_228 = 0;
  local_220 = 0;
  local_230 = (long *)&local_220;
  local_2e0 = std::__cxx11::string::find((char *)&local_bf8,0x1368bb,0);
  if (local_bf8 != &local_be8) {
    operator_delete(local_bf8);
  }
  if (local_230 != (long *)&local_220) {
    operator_delete(local_230);
  }
  iVar5 = std::__cxx11::string::find_last_of((char *)fname,0x136147,0xffffffffffffffff);
  if ((iVar5 != -1) && (folder._M_dataplus._M_p < (pointer)(long)iVar5)) {
    std::__cxx11::string::substr((ulong)local_9f0,(ulong)fname);
    plVar7 = (long *)std::__cxx11::string::_M_replace_aux
                               ((ulong)local_9f0,includeRes._M_t._M_impl._0_8_,0,'\x01');
    plVar17 = plVar7 + 2;
    if ((long *)*plVar7 == plVar17) {
      local_be8 = *plVar17;
      lStack_be0 = plVar7[3];
      local_bf8 = &local_be8;
    }
    else {
      local_be8 = *plVar17;
      local_bf8 = (long *)*plVar7;
    }
    _myfile = plVar7[1];
    *plVar7 = (long)plVar17;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_bf8);
    if (local_bf8 != &local_be8) {
      operator_delete(local_bf8);
    }
    if (local_9f0 != (undefined1  [8])&includeRes._M_t._M_impl.super__Rb_tree_header) {
      operator_delete((void *)local_9f0);
    }
  }
  contentExists(fname,true,&dummy_abi_cxx11_);
  folder.field_2._8_8_ = &trace._M_string_length;
  pcVar20 = (fname->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&folder.field_2 + 8),pcVar20,pcVar20 + fname->_M_string_length);
  std::ifstream::ifstream(&local_bf8,(string *)fname,_S_in);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 != '\0') {
    local_208 = (undefined1  [8])&line._M_string_length;
    line._M_dataplus._M_p = (pointer)0x0;
    line._M_string_length._0_1_ = 0;
    p_Var1 = &includeRes._M_t._M_impl.super__Rb_tree_header;
    local_2d8 = &(searchedScripts->_M_t)._M_impl.super__Rb_tree_header._M_header;
    trace.field_2._8_8_ = 0;
    sprite_val.field_2._12_4_ = 0;
    local_210 = hud_files;
LAB_0012d783:
    do {
      cVar4 = std::ios::widen((char)local_bf8[-3] + (char)(istream *)&local_bf8);
      piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&local_bf8,(string *)local_208,cVar4);
      s = &parts.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) goto LAB_0012f966;
      parts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_748;
      std::__cxx11::string::_M_construct<char*>
                ((string *)s,local_208,line._M_dataplus._M_p + (long)local_208);
      trimSpaces((string *)local_9f0,(string *)s);
      std::__cxx11::string::operator=((string *)local_208,(string *)local_9f0);
      if (local_9f0 != (undefined1  [8])p_Var1) {
        operator_delete((void *)local_9f0);
      }
      if (parts.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)local_748) {
        operator_delete(parts.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      sprite_val.field_2._12_4_ = sprite_val.field_2._12_4_ + 1;
      lVar9 = std::__cxx11::string::find((char *)local_208,0x1352c2,0);
      if (lVar9 != 0) {
        lVar9 = std::__cxx11::string::find((char *)local_208,0x1368cc,0);
        lVar22 = std::__cxx11::string::find((char *)local_208,0x1368cf,0);
        bVar25 = lVar9 != -1;
        bVar26 = lVar22 != -1;
        if (bVar26 && bVar25) {
          do {
            std::__cxx11::string::substr((ulong)local_50,(ulong)local_208);
            std::__cxx11::string::substr((ulong)((long)&sound_val.field_2 + 8),(ulong)local_208);
            pcVar20 = (pointer)0xf;
            if (local_50 != (undefined1  [8])&include._M_string_length) {
              pcVar20 = (pointer)include._M_string_length;
            }
            if (pcVar20 < ext._M_dataplus._M_p + include._M_dataplus._M_p) {
              pcVar20 = (pointer)0xf;
              if ((size_type *)sound_val.field_2._8_8_ != &ext._M_string_length) {
                pcVar20 = (pointer)ext._M_string_length;
              }
              if (pcVar20 < ext._M_dataplus._M_p + include._M_dataplus._M_p) goto LAB_0012d91e;
              puVar10 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)((long)&sound_val.field_2 + 8),0,(char *)0x0,
                                   (ulong)local_50);
            }
            else {
LAB_0012d91e:
              puVar10 = (undefined8 *)
                        std::__cxx11::string::_M_append(local_50,sound_val.field_2._8_8_);
            }
            puVar18 = puVar10 + 2;
            if ((_Rb_tree_header *)*puVar10 == (_Rb_tree_header *)puVar18) {
              includeRes._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = *puVar18;
              includeRes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)puVar10[3];
              local_9f0 = (undefined1  [8])p_Var1;
            }
            else {
              includeRes._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = *puVar18;
              local_9f0 = (undefined1  [8])*puVar10;
            }
            includeRes._M_t._M_impl._0_8_ = puVar10[1];
            *puVar10 = puVar18;
            puVar10[1] = 0;
            *(undefined1 *)puVar18 = 0;
            std::__cxx11::string::operator=((string *)local_208,(string *)local_9f0);
            if (local_9f0 != (undefined1  [8])p_Var1) {
              operator_delete((void *)local_9f0);
            }
            if ((size_type *)sound_val.field_2._8_8_ != &ext._M_string_length) {
              operator_delete((void *)sound_val.field_2._8_8_);
            }
            if (local_50 != (undefined1  [8])&include._M_string_length) {
              operator_delete((void *)local_50);
            }
            lVar9 = std::__cxx11::string::find((char *)local_208,0x1368cc,0);
            lVar22 = std::__cxx11::string::find((char *)local_208,0x1368cf,0);
            bVar25 = lVar9 != -1;
            bVar26 = lVar22 != -1;
          } while ((bVar26) && (lVar9 != -1));
        }
        if ((trace.field_2._8_8_ & 1) == 0) {
          if (!bVar25) goto LAB_0012daa4;
          std::__cxx11::string::substr((ulong)local_9f0,(ulong)local_208);
          uVar11 = std::__cxx11::string::operator=((string *)local_208,(string *)local_9f0);
          if (local_9f0 != (undefined1  [8])p_Var1) {
            operator_delete((void *)local_9f0);
            uVar11 = extraout_RAX;
          }
          trace.field_2._8_8_ = CONCAT71((int7)((ulong)uVar11 >> 8),1);
        }
        else {
          if (!bVar26) goto LAB_0012d783;
          std::__cxx11::string::substr((ulong)local_9f0,(ulong)local_208);
          std::__cxx11::string::operator=((string *)local_208,(string *)local_9f0);
          if (local_9f0 != (undefined1  [8])p_Var1) {
            operator_delete((void *)local_9f0);
          }
LAB_0012daa4:
          trace.field_2._8_8_ = 0;
        }
        line.field_2._8_8_ = &local_1d8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)((long)&line.field_2 + 8),local_208,
                   line._M_dataplus._M_p + (long)local_208);
        if (local_1e0 != 0) {
          lVar9 = 0;
          do {
            if (*(char *)(line.field_2._8_8_ + lVar9) == '\t') {
              *(undefined1 *)(line.field_2._8_8_ + lVar9) = 0x20;
            }
            lVar9 = lVar9 + 1;
          } while (local_1e0 != lVar9);
        }
        if ((undefined1 *)line.field_2._8_8_ == &local_1d8) {
          includeRes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Stack_1d0;
          local_9f0 = (undefined1  [8])p_Var1;
        }
        else {
          local_9f0 = (undefined1  [8])line.field_2._8_8_;
        }
        includeRes._M_t._M_impl.super__Rb_tree_header._M_header._1_7_ = uStack_1d7;
        includeRes._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = local_1d8;
        includeRes._M_t._M_impl._0_8_ = local_1e0;
        local_1e0 = 0;
        local_1d8 = 0;
        line.field_2._8_8_ = &local_1d8;
        std::__cxx11::string::operator=((string *)local_208,(string *)local_9f0);
        if (local_9f0 != (undefined1  [8])p_Var1) {
          operator_delete((void *)local_9f0);
        }
        if ((undefined1 *)line.field_2._8_8_ != &local_1d8) {
          operator_delete((void *)line.field_2._8_8_);
        }
        lVar9 = std::__cxx11::string::find((char *)local_208,0x1368d2,0);
        if (lVar9 == 0) {
          readQuote((string *)(&sound_val.field_2._M_allocated_capacity + 1),(string *)local_208);
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)(&sound_val.field_2._M_allocated_capacity + 1),0,(char *)0x0,
                               (ulong)local_1a8);
          puVar18 = puVar10 + 2;
          if ((_Rb_tree_header *)*puVar10 == (_Rb_tree_header *)puVar18) {
            includeRes._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = *puVar18;
            includeRes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)puVar10[3];
            local_9f0 = (undefined1  [8])p_Var1;
          }
          else {
            includeRes._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = *puVar18;
            local_9f0 = (undefined1  [8])*puVar10;
          }
          includeRes._M_t._M_impl._0_8_ = puVar10[1];
          *puVar10 = puVar18;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append(local_9f0);
          __str_2.field_2._8_8_ = &local_280;
          psVar19 = (size_type *)(plVar7 + 2);
          if ((size_type *)*plVar7 == psVar19) {
            local_280._M_allocated_capacity = *psVar19;
            local_280._8_8_ = plVar7[3];
          }
          else {
            local_280._M_allocated_capacity = *psVar19;
            __str_2.field_2._8_8_ = (size_type *)*plVar7;
          }
          *plVar7 = (long)psVar19;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          normalize_path((string *)local_50,(string *)((long)&__str_2.field_2 + 8),false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str_2.field_2._8_8_ != &local_280) {
            operator_delete((void *)__str_2.field_2._8_8_);
          }
          if (local_9f0 != (undefined1  [8])p_Var1) {
            operator_delete((void *)local_9f0);
          }
          if ((size_type *)sound_val.field_2._8_8_ != &ext._M_string_length) {
            operator_delete((void *)sound_val.field_2._8_8_);
          }
          iVar12 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&searchedScripts->_M_t,(key_type *)local_50);
          if (iVar12._M_node == local_2d8) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)searchedScripts,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                      );
            local_748._16_8_ = local_728;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(local_748 + 0x10),local_50,
                       include._M_dataplus._M_p + (long)local_50);
            push_unique(__return_storage_ptr__,(string *)(local_748 + 0x10));
            if ((undefined1 *)local_748._16_8_ != local_728) {
              operator_delete((void *)local_748._16_8_);
            }
            local_718._M_dataplus._M_p = (pointer)&local_718.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_718,local_50,include._M_dataplus._M_p + (long)local_50);
            get_script_dependencies((set_icase *)local_9f0,&local_718,searchedScripts,local_210);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_718._M_dataplus._M_p != &local_718.field_2) {
              operator_delete(local_718._M_dataplus._M_p);
            }
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,InsensitiveCompare,std::allocator<std::__cxx11::string>>
            ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,InsensitiveCompare,std::allocator<std::__cxx11::string>>
                        *)__return_storage_ptr__,
                       (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )includeRes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                       (_Base_ptr)&includeRes);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_InsensitiveCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_InsensitiveCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_9f0);
          }
          if (local_50 != (undefined1  [8])&include._M_string_length) {
            operator_delete((void *)local_50);
          }
        }
        if (local_2e0 == -1) {
          local_9f0 = (undefined1  [8])p_Var1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_9f0,local_208,line._M_dataplus._M_p + (long)local_208);
          auStack_148 = (undefined1  [8])0x0;
          values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          while( true ) {
            if ((includeRes._M_t._M_impl._0_8_ == 0) ||
               (uVar13 = std::__cxx11::string::find((char *)local_9f0,0x135972,0),
               includeRes._M_t._M_impl._0_8_ - 1 <= uVar13)) break;
            std::__cxx11::string::find((char *)local_9f0,0x135972,0);
            std::__cxx11::string::substr((ulong)local_50,(ulong)local_9f0);
            std::__cxx11::string::operator=((string *)local_9f0,(string *)local_50);
            if (local_50 != (undefined1  [8])&include._M_string_length) {
              operator_delete((void *)local_50);
            }
            lVar9 = std::__cxx11::string::find((char *)local_9f0,0x135972,0);
            if (lVar9 == -1) break;
            std::__cxx11::string::find((char *)local_9f0,0x135972,0);
            std::__cxx11::string::substr((ulong)local_50,(ulong)local_9f0);
            local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_6f8,local_50,include._M_dataplus._M_p + (long)local_50);
            get_ext((string *)((long)&sound_val.field_2 + 8),&local_6f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
              operator_delete(local_6f8._M_dataplus._M_p);
            }
            std::__cxx11::string::find((char *)local_9f0,0x135972,0);
            std::__cxx11::string::substr((ulong)local_128,(ulong)local_9f0);
            std::__cxx11::string::operator=((string *)local_9f0,(string *)local_128);
            if (local_128 != (undefined1  [8])&tmpVal._M_string_length) {
              operator_delete((void *)local_128);
            }
            if (include._M_dataplus._M_p != ext._M_dataplus._M_p + 1) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)auStack_148,(value_type *)local_50);
              local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_6d8,local_50,include._M_dataplus._M_p + (long)local_50);
              normalize_path((string *)local_128,&local_6d8,false);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
                operator_delete(local_6d8._M_dataplus._M_p);
              }
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&spr.field_2 + 8),"sound/",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_128);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&tmpVal.field_2 + 8),"sprites/",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_128);
              local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_6b8,local_128,tmpVal._M_dataplus._M_p + (long)local_128);
              iVar14 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_InsensitiveCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find(&default_content_abi_cxx11_._M_t,&local_6b8);
              uVar11 = 0x13e470;
              bVar26 = true;
              if ((_Rb_tree_header *)iVar14._M_node ==
                  &default_content_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
                bVar26 = contentExists((string *)local_128,false,&dummy_abi_cxx11_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
                operator_delete(local_6b8._M_dataplus._M_p);
              }
              local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_698,spr.field_2._8_8_,
                         sound_val._M_dataplus._M_p + spr.field_2._8_8_);
              iVar14 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_InsensitiveCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find(&default_content_abi_cxx11_._M_t,&local_698);
              uVar13 = CONCAT71((int7)((ulong)uVar11 >> 8),1);
              concatVal.field_2._12_4_ = (undefined4)uVar13;
              if ((_Rb_tree_header *)iVar14._M_node ==
                  &default_content_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
                bVar25 = contentExists((string *)((long)&spr.field_2 + 8),false,&dummy_abi_cxx11_);
                concatVal.field_2._12_4_ = (undefined4)CONCAT71(extraout_var,bVar25);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_698._M_dataplus._M_p != &local_698.field_2) {
                operator_delete(local_698._M_dataplus._M_p);
              }
              local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_678,tmpVal.field_2._8_8_,
                         sprite_val._M_dataplus._M_p + tmpVal.field_2._8_8_);
              iVar14 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_InsensitiveCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find(&default_content_abi_cxx11_._M_t,&local_678);
              bVar25 = true;
              if ((_Rb_tree_header *)iVar14._M_node ==
                  &default_content_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
                bVar25 = contentExists((string *)((long)&tmpVal.field_2 + 8),false,&dummy_abi_cxx11_
                                      );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_678._M_dataplus._M_p != &local_678.field_2) {
                operator_delete(local_678._M_dataplus._M_p);
              }
              if (((bVar26 == false && concatVal.field_2._M_local_buf[0xc] == '\0') &&
                  bVar25 == false) &&
                  0x20 < (ulong)((long)values.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start - (long)auStack_148
                                )) {
                ext.field_2._8_8_ = &concatVal._M_string_length;
                std::__cxx11::string::_M_construct<char_const*>((string *)((long)&ext.field_2 + 8));
                if ((undefined1  [8])
                    values.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != auStack_148) {
                  lVar9 = 8;
                  uVar23 = 0;
                  do {
                    std::__cxx11::string::_M_append
                              (ext.field_2._M_local_buf + 8,
                               *(ulong *)((long)auStack_148 + lVar9 + -8));
                    uVar23 = uVar23 + 1;
                    uVar13 = (long)values.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start - (long)auStack_148 >>
                             5;
                    lVar9 = lVar9 + 0x20;
                  } while (uVar23 < uVar13);
                }
                bVar26 = contentExists((string *)((long)&ext.field_2 + 8),false,&dummy_abi_cxx11_);
                if (bVar26) {
                  std::__cxx11::string::_M_assign((string *)local_50);
                  local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_658,local_50,include._M_dataplus._M_p + (long)local_50
                            );
                  normalize_path((string *)local_d8,&local_658,false);
                  std::__cxx11::string::operator=((string *)local_128,(string *)local_d8);
                  if (local_d8 != (undefined1  [8])&spr._M_string_length) {
                    operator_delete((void *)local_d8);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_658._M_dataplus._M_p != &local_658.field_2) {
                    operator_delete(local_658._M_dataplus._M_p);
                  }
                  std::operator+((string *)local_d8,"sound/",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_128);
                  std::__cxx11::string::operator=
                            ((string *)(spr.field_2._M_local_buf + 8),(string *)local_d8);
                  if (local_d8 != (undefined1  [8])&spr._M_string_length) {
                    operator_delete((void *)local_d8);
                  }
                  local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_4f8,local_128,
                             tmpVal._M_dataplus._M_p + (long)local_128);
                  iVar14 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_InsensitiveCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::find(&default_content_abi_cxx11_._M_t,&local_4f8);
                  if ((_Rb_tree_header *)iVar14._M_node ==
                      &default_content_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
                    contentExists((string *)local_128,false,&dummy_abi_cxx11_);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
                    operator_delete(local_4f8._M_dataplus._M_p);
                  }
                  local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_4d8,spr.field_2._8_8_,
                             sound_val._M_dataplus._M_p + spr.field_2._8_8_);
                  iVar14 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_InsensitiveCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::find(&default_content_abi_cxx11_._M_t,&local_4d8);
                  concatVal.field_2._12_4_ = (undefined4)CONCAT71((int7)(uVar13 >> 8),1);
                  if ((_Rb_tree_header *)iVar14._M_node ==
                      &default_content_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
                    bVar26 = contentExists((string *)((long)&spr.field_2 + 8),false,
                                           &dummy_abi_cxx11_);
                    concatVal.field_2._12_4_ = (undefined4)CONCAT71(extraout_var_00,bVar26);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
                    operator_delete(local_4d8._M_dataplus._M_p);
                  }
                  local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_4b8,tmpVal.field_2._8_8_,
                             sprite_val._M_dataplus._M_p + tmpVal.field_2._8_8_);
                  iVar14 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_InsensitiveCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::find(&default_content_abi_cxx11_._M_t,&local_4b8);
                  bVar25 = true;
                  if ((_Rb_tree_header *)iVar14._M_node ==
                      &default_content_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
                    bVar25 = contentExists((string *)((long)&tmpVal.field_2 + 8),false,
                                           &dummy_abi_cxx11_);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
                    operator_delete(local_4b8._M_dataplus._M_p);
                  }
                }
                else {
                  concatVal.field_2._12_4_ = 0;
                  bVar25 = false;
                }
                if ((size_type *)ext.field_2._8_8_ != &concatVal._M_string_length) {
                  operator_delete((void *)ext.field_2._8_8_);
                }
              }
              iVar5 = std::__cxx11::string::compare(sound_val.field_2._M_local_buf + 8);
              if (iVar5 == 0) {
                local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_498,local_50,include._M_dataplus._M_p + (long)local_50);
                normalize_path(&local_7a8,&local_498,false);
                local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_638,folder.field_2._8_8_,
                           trace._M_dataplus._M_p + folder.field_2._8_8_);
                add_model_resources(&local_7a8,__return_storage_ptr__,&local_638);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_638._M_dataplus._M_p != &local_638.field_2) {
                  operator_delete(local_638._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
                  operator_delete(local_7a8._M_dataplus._M_p);
                }
                paVar16 = &local_498.field_2;
                uVar11 = local_498._M_dataplus._M_p;
              }
              else {
                iVar5 = std::__cxx11::string::compare(sound_val.field_2._M_local_buf + 8);
                if (iVar5 == 0) {
                  ext.field_2._8_8_ = &concatVal._M_string_length;
                  plVar7 = (long *)local_50;
                  if (bVar25 != false) {
                    plVar7 = (long *)((long)&tmpVal.field_2 + 8);
                  }
                  psVar15 = &include;
                  if (bVar25 != false) {
                    psVar15 = &sprite_val;
                  }
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)((long)&ext.field_2 + 8),*plVar7,
                             (psVar15->_M_dataplus)._M_p + *plVar7);
                  local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_618,ext.field_2._8_8_,
                             concatVal._M_dataplus._M_p + ext.field_2._8_8_);
                  normalize_path((string *)local_d8,&local_618,false);
                  std::__cxx11::string::operator=((string *)local_50,(string *)local_d8);
                  if (local_d8 != (undefined1  [8])&spr._M_string_length) {
                    operator_delete((void *)local_d8);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_618._M_dataplus._M_p != &local_618.field_2) {
                    operator_delete(local_618._M_dataplus._M_p);
                  }
                  local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_478,local_50,include._M_dataplus._M_p + (long)local_50
                            );
                  local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_5f8,folder.field_2._8_8_,
                             trace._M_dataplus._M_p + folder.field_2._8_8_);
                  trace_missing_file(&local_478,&local_5f8,true);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
                    operator_delete(local_5f8._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_478._M_dataplus._M_p != &local_478.field_2) {
                    operator_delete(local_478._M_dataplus._M_p);
                  }
                  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_458,local_50,include._M_dataplus._M_p + (long)local_50
                            );
                  push_unique(__return_storage_ptr__,&local_458);
                  psVar15 = &local_458;
                  _Var21._M_p = local_458._M_dataplus._M_p;
LAB_0012e90d:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var21._M_p != &psVar15->field_2) {
                    operator_delete(_Var21._M_p);
                  }
                }
                else {
                  ext.field_2._8_8_ = &concatVal._M_string_length;
                  plVar7 = (long *)local_50;
                  if (concatVal.field_2._M_local_buf[0xc] != '\0') {
                    plVar7 = (long *)((long)&spr.field_2 + 8);
                  }
                  psVar15 = &include;
                  if (concatVal.field_2._M_local_buf[0xc] != '\0') {
                    psVar15 = &sound_val;
                  }
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)((long)&ext.field_2 + 8),*plVar7,
                             (psVar15->_M_dataplus)._M_p + *plVar7);
                  local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_5d8,ext.field_2._8_8_,
                             concatVal._M_dataplus._M_p + ext.field_2._8_8_);
                  normalize_path((string *)local_d8,&local_5d8,false);
                  std::__cxx11::string::operator=((string *)local_50,(string *)local_d8);
                  if (local_d8 != (undefined1  [8])&spr._M_string_length) {
                    operator_delete((void *)local_d8);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
                    operator_delete(local_5d8._M_dataplus._M_p);
                  }
                  lVar9 = 0;
                  do {
                    iVar5 = std::__cxx11::string::compare(sound_val.field_2._M_local_buf + 8);
                    if (iVar5 == 0) {
                      local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_438,local_50,
                                 include._M_dataplus._M_p + (long)local_50);
                      local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_5b8,folder.field_2._8_8_,
                                 trace._M_dataplus._M_p + folder.field_2._8_8_);
                      trace_missing_file(&local_438,&local_5b8,true);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
                        operator_delete(local_5b8._M_dataplus._M_p);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_438._M_dataplus._M_p != &local_438.field_2) {
                        operator_delete(local_438._M_dataplus._M_p);
                      }
                      local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_418,local_50,
                                 include._M_dataplus._M_p + (long)local_50);
                      push_unique(__return_storage_ptr__,&local_418);
                      psVar15 = &local_418;
                      _Var21._M_p = local_418._M_dataplus._M_p;
                      goto LAB_0012e90d;
                    }
                    lVar9 = lVar9 + 4;
                  } while (lVar9 != 0x58);
                }
                paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)&concatVal._M_string_length;
                uVar11 = ext.field_2._8_8_;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)uVar11 != paVar16) {
                operator_delete((void *)uVar11);
              }
              if ((size_type *)tmpVal.field_2._8_8_ != &sprite_val._M_string_length) {
                operator_delete((void *)tmpVal.field_2._8_8_);
              }
              if ((size_type *)spr.field_2._8_8_ != &sound_val._M_string_length) {
                operator_delete((void *)spr.field_2._8_8_);
              }
              if (local_128 != (undefined1  [8])&tmpVal._M_string_length) {
                operator_delete((void *)local_128);
              }
            }
            if ((size_type *)sound_val.field_2._8_8_ != &ext._M_string_length) {
              operator_delete((void *)sound_val.field_2._8_8_);
            }
            if (local_50 != (undefined1  [8])&include._M_string_length) {
              operator_delete((void *)local_50);
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_148);
          if (local_9f0 != (undefined1  [8])p_Var1) {
            operator_delete((void *)local_9f0);
          }
          lVar9 = std::__cxx11::string::find((char *)local_208,0x1368db,0);
          if (lVar9 != -1) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_128,"ERROR: Failed to parse custom weapon definition in ",fname);
            plVar7 = (long *)std::__cxx11::string::append((char *)local_128);
            sound_val.field_2._8_8_ = &ext._M_string_length;
            psVar19 = (size_type *)(plVar7 + 2);
            if ((size_type *)*plVar7 == psVar19) {
              ext._M_string_length = *psVar19;
              ext.field_2._M_allocated_capacity = plVar7[3];
            }
            else {
              ext._M_string_length = *psVar19;
              sound_val.field_2._8_8_ = (size_type *)*plVar7;
            }
            ext._M_dataplus._M_p = (pointer)plVar7[1];
            *plVar7 = (long)psVar19;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            __val = -sprite_val.field_2._12_4_;
            if (0 < (int)sprite_val.field_2._12_4_) {
              __val = sprite_val.field_2._12_4_;
            }
            __len = 1;
            if (9 < (uint)__val) {
              uVar13 = (ulong)(uint)__val;
              uVar24 = 4;
              do {
                __len = uVar24;
                uVar6 = (uint)uVar13;
                if (uVar6 < 100) {
                  __len = __len - 2;
                  goto LAB_0012eab3;
                }
                if (uVar6 < 1000) {
                  __len = __len - 1;
                  goto LAB_0012eab3;
                }
                if (uVar6 < 10000) goto LAB_0012eab3;
                uVar13 = uVar13 / 10000;
                uVar24 = __len + 4;
              } while (99999 < uVar6);
              __len = __len + 1;
            }
LAB_0012eab3:
            uVar24 = (uint)sprite_val.field_2._12_4_ >> 0x1f;
            spr.field_2._8_8_ = &sound_val._M_string_length;
            std::__cxx11::string::_M_construct
                      ((ulong)((long)&spr.field_2 + 8),
                       (char)__len - (char)((int)sprite_val.field_2._12_4_ >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)((ulong)uVar24 + spr.field_2._8_8_),__len,__val);
            pcVar20 = (pointer)0xf;
            if ((size_type *)sound_val.field_2._8_8_ != &ext._M_string_length) {
              pcVar20 = (pointer)ext._M_string_length;
            }
            if (pcVar20 < sound_val._M_dataplus._M_p + ext._M_dataplus._M_p) {
              pcVar20 = (pointer)0xf;
              if ((size_type *)spr.field_2._8_8_ != &sound_val._M_string_length) {
                pcVar20 = (pointer)sound_val._M_string_length;
              }
              if (pcVar20 < sound_val._M_dataplus._M_p + ext._M_dataplus._M_p) goto LAB_0012eb53;
              puVar10 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)((long)&spr.field_2 + 8),0,(char *)0x0,
                                   sound_val.field_2._8_8_);
            }
            else {
LAB_0012eb53:
              puVar10 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  (sound_val.field_2._M_local_buf + 8,spr.field_2._8_8_);
            }
            puVar18 = puVar10 + 2;
            if ((_Rb_tree_header *)*puVar10 == (_Rb_tree_header *)puVar18) {
              includeRes._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = *puVar18;
              includeRes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)puVar10[3];
              local_9f0 = (undefined1  [8])p_Var1;
            }
            else {
              includeRes._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = *puVar18;
              local_9f0 = (undefined1  [8])*puVar10;
            }
            includeRes._M_t._M_impl._0_8_ = puVar10[1];
            *puVar10 = puVar18;
            puVar10[1] = 0;
            *(undefined1 *)puVar18 = 0;
            plVar7 = (long *)std::__cxx11::string::append(local_9f0);
            local_50 = (undefined1  [8])&include._M_string_length;
            psVar19 = (size_type *)(plVar7 + 2);
            if ((size_type *)*plVar7 == psVar19) {
              include._M_string_length = *psVar19;
              include.field_2._M_allocated_capacity = plVar7[3];
            }
            else {
              include._M_string_length = *psVar19;
              local_50 = (undefined1  [8])*plVar7;
            }
            include._M_dataplus._M_p = (pointer)plVar7[1];
            *plVar7 = (long)psVar19;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            if (local_9f0 != (undefined1  [8])p_Var1) {
              operator_delete((void *)local_9f0);
            }
            if ((size_type *)spr.field_2._8_8_ != &sound_val._M_string_length) {
              operator_delete((void *)spr.field_2._8_8_);
            }
            if ((size_type *)sound_val.field_2._8_8_ != &ext._M_string_length) {
              operator_delete((void *)sound_val.field_2._8_8_);
            }
            if (local_128 != (undefined1  [8])&tmpVal._M_string_length) {
              operator_delete((void *)local_128);
            }
            std::__cxx11::string::find((char *)local_208,0x1368db,0);
            sound_val.field_2._8_8_ = &ext._M_string_length;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(sound_val.field_2._M_local_buf + 8),
                       "g_ItemRegistry.RegisterWeapon(","");
            std::__cxx11::string::substr((ulong)local_9f0,(ulong)local_208);
            std::__cxx11::string::operator=((string *)local_208,(string *)local_9f0);
            if (local_9f0 != (undefined1  [8])p_Var1) {
              operator_delete((void *)local_9f0);
            }
            if ((size_type *)sound_val.field_2._8_8_ != &ext._M_string_length) {
              operator_delete((void *)sound_val.field_2._8_8_);
            }
            iVar5 = std::__cxx11::string::find_first_of((char *)local_208,0x136700,0);
            if ((pointer)(long)iVar5 < line._M_dataplus._M_p + -1) {
              std::__cxx11::string::substr((ulong)&local_7e8,(ulong)local_208);
              trimSpaces((string *)((long)&sound_val.field_2 + 8),&local_7e8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
                operator_delete(local_7e8._M_dataplus._M_p);
              }
              std::__cxx11::string::substr((ulong)local_9f0,(ulong)local_208);
              std::__cxx11::string::operator=((string *)local_208,(string *)local_9f0);
              if (local_9f0 != (undefined1  [8])p_Var1) {
                operator_delete((void *)local_9f0);
              }
              iVar5 = std::__cxx11::string::find_first_of((char *)local_208,0x136700,0);
              if (iVar5 == -1) {
                iVar5 = std::__cxx11::string::find_last_of
                                  ((char *)local_208,0x135e16,0xffffffffffffffff);
              }
              if ((pointer)(long)iVar5 < line._M_dataplus._M_p + -1) {
                std::__cxx11::string::substr((ulong)&local_7c8,(ulong)local_208);
                trimSpaces((string *)local_128,&local_7c8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
                  operator_delete(local_7c8._M_dataplus._M_p);
                }
                local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_3f8,sound_val.field_2._8_8_,
                           ext._M_dataplus._M_p + sound_val.field_2._8_8_);
                local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
                pcVar20 = (fname->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_3d8,pcVar20,pcVar20 + fname->_M_string_length);
                local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_598,local_50,include._M_dataplus._M_p + (long)local_50);
                parse_script_arg((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_788,&local_3f8,&local_3d8,&local_598);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_598._M_dataplus._M_p != &local_598.field_2) {
                  operator_delete(local_598._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
                  operator_delete(local_3d8._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                  operator_delete(local_3f8._M_dataplus._M_p);
                }
                ret2.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_390;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)
                           &ret2.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,local_128,
                           tmpVal._M_dataplus._M_p + (long)local_128);
                local_380._M_allocated_capacity = (size_type)local_370;
                pcVar20 = (fname->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)((long)local_390 + 0x10),pcVar20,
                           pcVar20 + fname->_M_string_length);
                local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_578,local_50,include._M_dataplus._M_p + (long)local_50);
                parse_script_arg((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_3b8,
                                 (string *)
                                 &ret2.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (string *)((long)local_390 + 0x10),&local_578);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_578._M_dataplus._M_p != &local_578.field_2) {
                  operator_delete(local_578._M_dataplus._M_p);
                }
                if ((undefined1 *)local_380._M_allocated_capacity != local_370) {
                  operator_delete((void *)local_380._M_allocated_capacity);
                }
                if (ret2.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390)
                {
                  operator_delete(ret2.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
                }
                if (((undefined1  [8])
                     ret1.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start != local_788) &&
                   ((undefined1  [8])
                    ret2.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != local_3b8)) {
                  if (((ulong)((long)ret1.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start - (long)local_788) <
                       0x21) &&
                     ((ulong)((long)ret2.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start - (long)local_3b8) <
                      0x21)) {
                    std::__cxx11::string::_M_assign((string *)(sound_val.field_2._M_local_buf + 8));
                    std::__cxx11::string::_M_assign((string *)local_128);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(ext.field_2._M_local_buf + 8),"sprites/",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_128);
                    plVar7 = (long *)std::__cxx11::string::append(ext.field_2._M_local_buf + 8);
                    tmpVal.field_2._8_8_ = &sprite_val._M_string_length;
                    psVar19 = (size_type *)(plVar7 + 2);
                    if ((size_type *)*plVar7 == psVar19) {
                      sprite_val._M_string_length = *psVar19;
                      sprite_val.field_2._M_allocated_capacity = plVar7[3];
                    }
                    else {
                      sprite_val._M_string_length = *psVar19;
                      tmpVal.field_2._8_8_ = (size_type *)*plVar7;
                    }
                    sprite_val._M_dataplus._M_p = (pointer)plVar7[1];
                    *plVar7 = (long)psVar19;
                    plVar7[1] = 0;
                    *(undefined1 *)(plVar7 + 2) = 0;
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_9f0,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)&tmpVal.field_2 + 8),
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(sound_val.field_2._M_local_buf + 8));
                    plVar7 = (long *)std::__cxx11::string::append((char *)local_9f0);
                    spr.field_2._8_8_ = &sound_val._M_string_length;
                    psVar19 = (size_type *)(plVar7 + 2);
                    if ((size_type *)*plVar7 == psVar19) {
                      sound_val._M_string_length = *psVar19;
                      sound_val.field_2._M_allocated_capacity = plVar7[3];
                    }
                    else {
                      sound_val._M_string_length = *psVar19;
                      spr.field_2._8_8_ = (size_type *)*plVar7;
                    }
                    sound_val._M_dataplus._M_p = (pointer)plVar7[1];
                    *plVar7 = (long)psVar19;
                    plVar7[1] = 0;
                    *(undefined1 *)(plVar7 + 2) = 0;
                    if (local_9f0 != (undefined1  [8])p_Var1) {
                      operator_delete((void *)local_9f0);
                    }
                    if ((size_type *)tmpVal.field_2._8_8_ != &sprite_val._M_string_length) {
                      operator_delete((void *)tmpVal.field_2._8_8_);
                    }
                    if ((size_type *)ext.field_2._8_8_ != &concatVal._M_string_length) {
                      operator_delete((void *)ext.field_2._8_8_);
                    }
                    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_360,spr.field_2._8_8_,
                               sound_val._M_dataplus._M_p + spr.field_2._8_8_);
                    local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_558,folder.field_2._8_8_,
                               trace._M_dataplus._M_p + folder.field_2._8_8_);
                    trace_missing_file(&local_360,&local_558,true);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_558._M_dataplus._M_p != &local_558.field_2) {
                      operator_delete(local_558._M_dataplus._M_p);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_360._M_dataplus._M_p != &local_360.field_2) {
                      operator_delete(local_360._M_dataplus._M_p);
                    }
                    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_340,spr.field_2._8_8_,
                               sound_val._M_dataplus._M_p + spr.field_2._8_8_);
                    push_unique(local_210,&local_340);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_340._M_dataplus._M_p != &local_340.field_2) {
                      operator_delete(local_340._M_dataplus._M_p);
                    }
                    tmpVal.field_2._8_8_ = &sprite_val._M_string_length;
                    psVar15 = (string *)((long)&tmpVal.field_2 + 8);
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)psVar15,spr.field_2._8_8_,
                               sound_val._M_dataplus._M_p + spr.field_2._8_8_);
                    bVar26 = contentExists(psVar15,true,&dummy_abi_cxx11_);
                    if (bVar26) {
                      std::ifstream::ifstream
                                (local_9f0,(string *)(tmpVal.field_2._M_local_buf + 8),_S_in);
                      cVar4 = std::__basic_file<char>::is_open();
                      if (cVar4 != '\0') {
                        ext.field_2._8_8_ = &concatVal._M_string_length;
                        concatVal._M_dataplus._M_p = (pointer)0x0;
                        concatVal._M_string_length._0_1_ = 0;
                        while( true ) {
                          cVar4 = std::ios::widen((char)*(undefined8 *)((long)local_9f0 + -0x18) +
                                                  (char)(istream *)local_9f0);
                          piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                             ((istream *)local_9f0,
                                              (string *)(ext.field_2._M_local_buf + 8),cVar4);
                          if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0)
                          break;
                          lVar9 = std::__cxx11::string::find
                                            (ext.field_2._M_local_buf + 8,0x1352c2,0);
                          if (lVar9 != -1) {
                            std::__cxx11::string::substr
                                      ((ulong)local_d8,(ulong)(ext.field_2._M_local_buf + 8));
                            std::__cxx11::string::operator=
                                      ((string *)(ext.field_2._M_local_buf + 8),(string *)local_d8);
                            if (local_d8 != (undefined1  [8])&spr._M_string_length) {
                              operator_delete((void *)local_d8);
                            }
                          }
                          local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&local_538,ext.field_2._8_8_,
                                     concatVal._M_dataplus._M_p + ext.field_2._8_8_);
                          trimSpaces((string *)local_d8,&local_538);
                          std::__cxx11::string::operator=
                                    ((string *)(ext.field_2._M_local_buf + 8),(string *)local_d8);
                          if (local_d8 != (undefined1  [8])&spr._M_string_length) {
                            operator_delete((void *)local_d8);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_538._M_dataplus._M_p != &local_538.field_2) {
                            operator_delete(local_538._M_dataplus._M_p);
                          }
                          local_1c8 = &local_1b8;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&local_1c8,ext.field_2._8_8_,
                                     concatVal._M_dataplus._M_p + ext.field_2._8_8_);
                          if (local_1c0 != (pointer)0x0) {
                            pcVar20 = (pointer)0x0;
                            do {
                              if (*(char *)((long)local_1c8 + (long)pcVar20) == '\t') {
                                *(char *)((long)local_1c8 + (long)pcVar20) = ' ';
                              }
                              pcVar20 = pcVar20 + 1;
                            } while (local_1c0 != pcVar20);
                          }
                          if (local_1c8 == &local_1b8) {
                            spr.field_2._M_allocated_capacity = sStack_1b0;
                            local_d8 = (undefined1  [8])&spr._M_string_length;
                          }
                          else {
                            local_d8 = (undefined1  [8])local_1c8;
                          }
                          spr._M_string_length = CONCAT71(local_1b8._1_7_,(undefined1)local_1b8);
                          spr._M_dataplus._M_p = local_1c0;
                          local_1c0 = (pointer)0x0;
                          local_1b8._0_1_ = 0;
                          local_1c8 = &local_1b8;
                          std::__cxx11::string::operator=
                                    ((string *)(ext.field_2._M_local_buf + 8),(string *)local_d8);
                          if (local_d8 != (undefined1  [8])&spr._M_string_length) {
                            operator_delete((void *)local_d8);
                          }
                          if (local_1c8 != &local_1b8) {
                            operator_delete(local_1c8);
                          }
                          local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&local_518,ext.field_2._8_8_,
                                     concatVal._M_dataplus._M_p + ext.field_2._8_8_);
                          splitString((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)&ret1.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                      &local_518," ");
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_518._M_dataplus._M_p != &local_518.field_2) {
                            operator_delete(local_518._M_dataplus._M_p);
                          }
                          if (0x40 < (ulong)((long)parts.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start -
                                            (long)ret1.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            )) {
                            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)auStack_148,"sprites/",
                                           ret1.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 2);
                            plVar7 = (long *)std::__cxx11::string::append((char *)auStack_148);
                            local_d8 = (undefined1  [8])&spr._M_string_length;
                            psVar19 = (size_type *)(plVar7 + 2);
                            if ((size_type *)*plVar7 == psVar19) {
                              spr._M_string_length = *psVar19;
                              spr.field_2._M_allocated_capacity = plVar7[3];
                            }
                            else {
                              spr._M_string_length = *psVar19;
                              local_d8 = (undefined1  [8])*plVar7;
                            }
                            spr._M_dataplus._M_p = (pointer)plVar7[1];
                            *plVar7 = (long)psVar19;
                            plVar7[1] = 0;
                            *(undefined1 *)(plVar7 + 2) = 0;
                            if (auStack_148 !=
                                (undefined1  [8])
                                &values.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish) {
                              operator_delete((void *)auStack_148);
                            }
                            local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
                            std::__cxx11::string::_M_construct<char*>
                                      ((string *)&local_320,local_d8,
                                       spr._M_dataplus._M_p + (long)local_d8);
                            auStack_148 = (undefined1  [8])
                                          &values.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish;
                            std::__cxx11::string::_M_construct<char*>
                                      ((string *)auStack_148,folder.field_2._8_8_,
                                       trace._M_dataplus._M_p + folder.field_2._8_8_);
                            std::__cxx11::string::append((char *)auStack_148);
                            plVar7 = (long *)std::__cxx11::string::_M_append
                                                       ((char *)auStack_148,spr.field_2._8_8_);
                            __str_3.field_2._8_8_ = &local_240;
                            psVar19 = (size_type *)(plVar7 + 2);
                            if ((size_type *)*plVar7 == psVar19) {
                              local_240._M_allocated_capacity = *psVar19;
                              local_240._8_8_ = plVar7[3];
                            }
                            else {
                              local_240._M_allocated_capacity = *psVar19;
                              __str_3.field_2._8_8_ = (size_type *)*plVar7;
                            }
                            *plVar7 = (long)psVar19;
                            plVar7[1] = 0;
                            *(undefined1 *)(plVar7 + 2) = 0;
                            trace_missing_file(&local_320,(string *)((long)&__str_3.field_2 + 8),
                                               true);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)__str_3.field_2._8_8_ != &local_240) {
                              operator_delete((void *)__str_3.field_2._8_8_);
                            }
                            if (auStack_148 !=
                                (undefined1  [8])
                                &values.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish) {
                              operator_delete((void *)auStack_148);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_320._M_dataplus._M_p != &local_320.field_2) {
                              operator_delete(local_320._M_dataplus._M_p);
                            }
                            local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
                            std::__cxx11::string::_M_construct<char*>
                                      ((string *)&local_300,local_d8,
                                       spr._M_dataplus._M_p + (long)local_d8);
                            push_unique(__return_storage_ptr__,&local_300);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_300._M_dataplus._M_p != &local_300.field_2) {
                              operator_delete(local_300._M_dataplus._M_p);
                            }
                            if (local_d8 != (undefined1  [8])&spr._M_string_length) {
                              operator_delete((void *)local_d8);
                            }
                          }
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&ret1.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                        }
                        if ((size_type *)ext.field_2._8_8_ != &concatVal._M_string_length) {
                          operator_delete((void *)ext.field_2._8_8_);
                        }
                      }
                      std::ifstream::close();
                      std::ifstream::~ifstream(local_9f0);
                    }
                    if ((size_type *)tmpVal.field_2._8_8_ != &sprite_val._M_string_length) {
                      operator_delete((void *)tmpVal.field_2._8_8_);
                    }
                    pbVar3 = &sound_val;
                    uVar11 = spr.field_2._8_8_;
                  }
                  else {
                    local_270 = &__str_3._M_string_length;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_270,local_50,
                               include._M_dataplus._M_p + (long)local_50);
                    dVar2 = (double)std::__cxx11::string::append((char *)&local_270);
                    log(dVar2);
                    pbVar3 = &__str_3;
                    uVar11 = local_270;
                  }
                  if ((size_type *)uVar11 != &pbVar3->_M_string_length) {
                    operator_delete((void *)uVar11);
                  }
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_3b8);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_788);
                pbVar3 = &tmpVal;
                uVar11 = local_128;
              }
              else {
                __str_1.field_2._8_8_ = &__str_2._M_string_length;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)(__str_1.field_2._M_local_buf + 8),local_50,
                           include._M_dataplus._M_p + (long)local_50);
                dVar2 = (double)std::__cxx11::string::append(__str_1.field_2._M_local_buf + 8);
                log(dVar2);
                pbVar3 = &__str_2;
                uVar11 = __str_1.field_2._8_8_;
              }
              if ((size_type *)uVar11 != &pbVar3->_M_string_length) {
                operator_delete((void *)uVar11);
              }
              pbVar3 = &ext;
              uVar11 = sound_val.field_2._8_8_;
            }
            else {
              local_2d0 = &__str_1._M_string_length;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2d0,local_50,include._M_dataplus._M_p + (long)local_50);
              dVar2 = (double)std::__cxx11::string::append((char *)&local_2d0);
              log(dVar2);
              pbVar3 = &__str_1;
              uVar11 = local_2d0;
            }
            if ((size_type *)uVar11 != &pbVar3->_M_string_length) {
              operator_delete((void *)uVar11);
            }
            if (local_50 != (undefined1  [8])&include._M_string_length) {
              operator_delete((void *)local_50);
            }
          }
        }
      }
    } while( true );
  }
LAB_0012f97e:
  std::ifstream::close();
  std::ifstream::~ifstream(&local_bf8);
  if ((size_type *)folder.field_2._8_8_ != &trace._M_string_length) {
    operator_delete((void *)folder.field_2._8_8_);
  }
  if (local_1a8 != &folder._M_string_length) {
    operator_delete(local_1a8);
  }
  return __return_storage_ptr__;
LAB_0012f966:
  if (local_208 != (undefined1  [8])&line._M_string_length) {
    operator_delete((void *)local_208);
  }
  goto LAB_0012f97e;
}

Assistant:

set_icase get_script_dependencies(string fname, set<string>& searchedScripts, set_icase& hud_files)
{
	set_icase resources;

	string folder = "scripts/maps/";

	// ignore sounds/models in this script. They're false positives.
	bool isWeaponCustom = toLowerCase(fname).find("weapon_custom.as") != string::npos;

	int idir = fname.find_last_of("/\\");
	if (idir != string::npos && idir > folder.length())
		folder = fname.substr(0, idir) + '/';

	contentExists(fname, true); // fix caps

	string trace = fname;

	ifstream myfile(fname);
	if (myfile.is_open())
	{
		int lineNum = 0;
		bool inCommentBlock = false;
		string line;
		while (getline(myfile, line))
		{
			lineNum++;

			line = trimSpaces(line);
			if (line.find("//") == 0)
				continue;
			
			// check for block comments
			{	
				size_t commentStart = line.find("/*");
				size_t commentEnd = line.find("*/");

				// remove inline block comments
				while (commentStart != string::npos && commentEnd != string::npos)
				{
					line = line.substr(0, commentStart) + line.substr(commentEnd+2);
					commentStart = line.find("/*");
					commentEnd = line.find("*/");
				}

				// ignore lines contained in comment blocks
				if (inCommentBlock)
				{
					if (commentEnd != string::npos)
					{
						inCommentBlock = false;
						line = line.substr(commentEnd+2);
						commentStart = commentEnd = string::npos;
					}
					else
						continue;
				}				
				else if (commentStart != string::npos)
				{
					line = line.substr(0, commentStart);
					inCommentBlock = true;
				}
			}

			line = replaceChar(line, '\t', ' ' );
			
			if (line.find("#include") == 0) 
			{
				// .as extension is optional in cfg file, but required to be ommitted in #include statements
				string include = normalize_path(folder + readQuote(line) + ".as");
				if (searchedScripts.find(include) == searchedScripts.end())
				{
					searchedScripts.insert(include);
					push_unique(resources, include);
					set_icase includeRes = get_script_dependencies(include, searchedScripts, hud_files);
					resources.insert(includeRes.begin(), includeRes.end());
				}
			}

			// look for string literals
			if (!isWeaponCustom) {
				string s = line;
				vector<string> values;
				while (s.length())
				{
					if (s.find("\"") >= s.length() - 1)
						break;
					s = s.substr(s.find("\"") + 1);

					if (s.find("\"") == string::npos)
						break;

					string val = s.substr(0, s.find("\""));
					string ext = get_ext(val);

					s = s.substr(s.find("\"")+1);	

					if (val.length() == ext.length() + 1)
						continue; // probably a path constructed from vars

					values.push_back(val);

					// handle case where the full path is broken up into separate string literals for no reason
					string tmpVal = normalize_path(val);
					string sound_val = "sound/" + tmpVal;
					string sprite_val = "sprites/" + tmpVal;
					bool valExists = is_default_file(tmpVal) || contentExists(tmpVal, false);
					bool soundValExists = is_default_file(sound_val) || contentExists(sound_val, false);
					bool spriteValExists = is_default_file(sprite_val) || contentExists(sprite_val, false);
					if (values.size() > 1 && !valExists && !soundValExists && !spriteValExists)
					{
						string concatVal = "";
						for (int i = 0; i < values.size(); i++)
							concatVal += values[i];
						if (contentExists(concatVal, false))
						{
							val = concatVal;
							
							tmpVal = normalize_path(val);
							sound_val = "sound/" + tmpVal;
							valExists = is_default_file(tmpVal) || contentExists(tmpVal, false);
							soundValExists = is_default_file(sound_val) || contentExists(sound_val, false);
							spriteValExists = is_default_file(sprite_val) || contentExists(sprite_val, false);
						}
					}

					if (ext == "mdl")
					{
						add_model_resources(normalize_path(val), resources, trace);
					}
					else if (ext == "spr")
					{
						// sprites/ prefix is optional for HUD parameters
						string valpath = spriteValExists ? sprite_val : val;

						val = normalize_path(valpath);
						trace_missing_file(val, trace, true);
						push_unique(resources, val);
					}
					else
					{
						// probably safe to assume the script is using sounds correctly,
						// so it's ok if the prefix is missing. Just try to find a plausible match.
						// There will be too many false positives otherwise.
						string valpath = soundValExists ? sound_val : val;
						
						val = normalize_path(valpath);
						for (int k = 0; k < NUM_SOUND_EXTS; k++)
						{
							if (ext == g_valid_exts[k])
							{
								trace_missing_file(val, trace, true);
								push_unique(resources, val);
								break;
							}
						}
					}
				}
				
			}

			// try to parse out custom weapon sprite files
			if (!isWeaponCustom && line.find("g_ItemRegistry.RegisterWeapon(") != string::npos)
			{
				string err = "ERROR: Failed to parse custom weapon definition in " + fname + " (line " + to_string(lineNum) + ")\n";
				line = line.substr(line.find("g_ItemRegistry.RegisterWeapon(") + string("g_ItemRegistry.RegisterWeapon(").length());
				int comma = line.find_first_of(",");
				if (comma >= line.length()-1)
				{
					log(err + "\t Reason: couldn't find all arguments on this line\n");
					continue;
				}
				string arg1 = trimSpaces(line.substr(0, comma));

				line = line.substr(comma+1);
				int comma2 = line.find_first_of(",");
				if (comma2 == string::npos)
					comma2 = line.find_last_of(")"); // third arg is optional
				if (comma2 >= line.length()-1)
				{
					log(err + "\t Reason: couldn't find all arguments on this line\n");
					continue;
				}
				string arg2 = trimSpaces(line.substr(0, comma2));

				vector<string> ret1 = parse_script_arg(arg1, fname, err);
				vector<string> ret2 = parse_script_arg(arg2, fname, err);

				if (ret1.size() == 0 || ret2.size() == 0)
					continue;

				if (ret1.size() > 1 || ret2.size() > 1)
				{
					log(err + "\t Reason: array argument(s) with variable index not handled\n");
					continue;
				}

				arg1 = ret1[0];
				arg2 = ret2[0];

				// Note: code duplicated in Bsp.cpp (weapon_custom)
				string hud_file = "sprites/" + arg2 + "/" + arg1 + ".txt";
				trace_missing_file(hud_file, trace, true);
				push_unique(hud_files, hud_file);

				string hud_path = hud_file;
				if (contentExists(hud_path, true))
				{
					ifstream file(hud_path);
					if (file.is_open())
					{
						int lineNum = 0;
						bool in_func_body = false;
						string line;
						while (getline(file, line))
						{
							lineNum++;

							// strip comments
							size_t cpos = line.find("//");
							if (cpos != string::npos)
								line = line.substr(0, cpos);

							line = trimSpaces(line);

							line = replaceChar(line, '\t', ' ');
							vector<string> parts = splitString(line, " ");

							if (parts.size() < 3)
								continue;
							
							string spr = "sprites/" + parts[2] + ".spr";
							trace_missing_file(spr, trace + " --> " + hud_file, true);
							push_unique(resources, spr);
						}
					}
					file.close();
				}
			}
		}
	}
	//else
	//	cout << "Failed to open: " << fname << endl; // not needed - file will be flagged as missing later
	myfile.close();

	return resources;
}